

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalParse
          (CodeGeneratorResponse *this,char *ptr,ParseContext *ctx)

{
  ParseContext *this_00;
  bool bVar1;
  uint uVar2;
  string *s;
  uint64_t uVar3;
  CodeGeneratorResponse_File *msg;
  ulong tag_00;
  UnknownFieldSet *unknown;
  string *str;
  uint32_t tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  CodeGeneratorResponse *this_local;
  
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  internal::HasBits<1UL>::HasBits((HasBits<1UL> *)((long)&str + 4));
LAB_004d9b55:
  do {
    bVar1 = internal::ParseContext::Done(_tag,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_004d9d52;
    ctx_local = (ParseContext *)internal::ReadTag((char *)ctx_local,(uint32_t *)&str,0);
    uVar2 = (uint)str >> 3;
    if (uVar2 == 1) {
      if (((uint)str & 0xff) != 10) goto LAB_004d9cdc;
      s = _internal_mutable_error_abi_cxx11_(this);
      ctx_local = (ParseContext *)internal::InlineGreedyStringParser(s,(char *)ctx_local,_tag);
      internal::VerifyUTF8(s,"google.protobuf.compiler.CodeGeneratorResponse.error");
    }
    else {
      if (uVar2 == 2) {
        if (((uint)str & 0xff) == 0x10) {
          _Internal::set_has_supported_features((HasBits *)((long)&str + 4));
          uVar3 = internal::ReadVarint64((char **)&ctx_local);
          this->supported_features_ = uVar3;
          goto joined_r0x004d9c3d;
        }
      }
      else if ((uVar2 == 0xf) && (((uint)str & 0xff) == 0x7a)) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          this_00 = _tag;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg = _internal_add_file(this);
          ctx_local = (ParseContext *)
                      internal::ParseContext::ParseMessage
                                (this_00,(MessageLite *)msg,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) goto LAB_004d9d6d;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&_tag->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<122u>((char *)ctx_local), bVar1));
        goto LAB_004d9b55;
      }
LAB_004d9cdc:
      if (((uint)str == 0) || (((uint)str & 7) == 4)) {
        if (ctx_local != (ParseContext *)0x0) {
          internal::EpsCopyInputStream::SetLastTag(&_tag->super_EpsCopyInputStream,(uint)str);
          goto LAB_004d9d52;
        }
        goto LAB_004d9d6d;
      }
      tag_00 = (ulong)(uint)str;
      unknown = internal::InternalMetadata::
                mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                          (&(this->super_Message).super_MessageLite._internal_metadata_);
      ctx_local = (ParseContext *)internal::UnknownFieldParse(tag_00,unknown,(char *)ctx_local,_tag)
      ;
    }
joined_r0x004d9c3d:
    if (ctx_local == (ParseContext *)0x0) {
LAB_004d9d6d:
      ctx_local = (ParseContext *)0x0;
LAB_004d9d52:
      internal::HasBits<1UL>::Or(&this->_has_bits_,(HasBits<1UL> *)((long)&str + 4));
      return (char *)ctx_local;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorResponse::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string error = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_error();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.error");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional uint64 supported_features = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_supported_features(&has_bits);
          supported_features_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}